

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

stbi_uc * tga_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc sVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  stbi_uc *psVar15;
  ulong uVar16;
  ulong uVar17;
  char cVar18;
  ulong uVar19;
  uchar raw_data [4];
  uint local_a4;
  stbi_uc *local_a0;
  stbi_uc *local_58;
  
  uVar4 = get8(s);
  iVar5 = get8(s);
  uVar6 = get8(s);
  iVar7 = get16le(s);
  iVar8 = get16le(s);
  uVar9 = get8(s);
  get16le(s);
  get16le(s);
  iVar10 = get16le(s);
  iVar11 = get16le(s);
  uVar12 = get8(s);
  uVar13 = get8(s);
  uVar14 = (uVar6 & 0xff) - 8;
  if ((uVar6 & 0xf8) == 0) {
    uVar14 = uVar6 & 0xff;
  }
  local_a0 = (stbi_uc *)0x0;
  if (((0 < iVar10) && (0 < iVar11)) && (0xfffffffc < uVar14 - 4)) {
    if ((byte)((char)uVar12 << 5 | (byte)((char)uVar12 - 8U) >> 3) < 4) {
      cVar18 = (char)iVar5;
      uVar14 = uVar12 & 0xff;
      if (cVar18 != '\0') {
        uVar14 = uVar9 & 0xff;
      }
      *x = iVar10;
      *y = iVar11;
      uVar12 = uVar14 >> 3;
      if (req_comp - 5U < 0xfffffffc) {
        req_comp = uVar12;
      }
      *comp = uVar12;
      local_a0 = (stbi_uc *)malloc((ulong)(uint)(req_comp * iVar11 * iVar10));
      skip(s,uVar4 & 0xff);
      if (cVar18 == '\0') {
        local_58 = (stbi_uc *)0x0;
      }
      else {
        skip(s,iVar7);
        iVar5 = (int)((uVar9 & 0xff) * iVar8) / 8;
        local_58 = (stbi_uc *)malloc((long)iVar5);
        getn(s,local_58,iVar5);
      }
      uVar4 = uVar14 << 0x1d | uVar14 - 8 >> 3;
      uVar19 = (ulong)(uVar14 + 7 >> 3);
      bVar3 = 1;
      iVar5 = 0;
      local_a4 = 0;
      for (uVar17 = 0; uVar17 != (uint)(iVar11 * iVar10); uVar17 = uVar17 + 1) {
        if ((uVar6 & 0xf8) == 0) {
LAB_0014cb40:
          if (cVar18 == '\0') {
            for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
              iVar7 = get8(s);
              raw_data[uVar16] = (uchar)iVar7;
            }
          }
          else {
            uVar14 = get8(s);
            uVar14 = uVar14 & 0xff;
            if (iVar8 <= (int)uVar14) {
              uVar14 = 0;
            }
            for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
              raw_data[uVar16] = local_58[uVar16 + uVar14 * uVar12];
            }
          }
          if (uVar4 < 4) {
            psVar15 = (stbi_uc *)
                      (*(code *)(&DAT_00183144 + *(int *)(&DAT_00183144 + (ulong)uVar4 * 4)))();
            return psVar15;
          }
        }
        else {
          if (iVar5 == 0) {
            uVar14 = get8(s);
            iVar5 = (uVar14 & 0x7f) + 1;
            local_a4 = uVar14 >> 7 & 1;
            goto LAB_0014cb40;
          }
          if ((bool)(local_a4 == 0 | bVar3)) {
            local_a4 = (uint)(local_a4 != 0);
            goto LAB_0014cb40;
          }
          local_a4 = 1;
        }
        switch(req_comp) {
        case 1:
          local_a0[uVar17] = '\0';
          break;
        case 2:
          local_a0[uVar17 * 2] = '\0';
          local_a0[uVar17 * 2 + 1] = '\0';
          break;
        case 3:
          lVar2 = uVar17 * 3;
          local_a0[lVar2] = '\0';
          local_a0[lVar2 + 1] = '\0';
          local_a0[lVar2 + 2] = '\0';
          break;
        case 4:
          local_a0[uVar17 * 4] = '\0';
          local_a0[uVar17 * 4 + 1] = '\0';
          local_a0[uVar17 * 4 + 2] = '\0';
          local_a0[uVar17 * 4 + 3] = '\0';
        }
        iVar5 = iVar5 + -1;
        bVar3 = 0;
      }
      if ((uVar13 & 0x20) == 0) {
        iVar10 = req_comp * iVar10;
        iVar5 = (iVar11 + -1) * iVar10;
        uVar14 = 0;
        for (iVar7 = 0; iVar7 * 2 < iVar11; iVar7 = iVar7 + 1) {
          psVar15 = local_a0;
          for (iVar8 = iVar10; 0 < iVar8; iVar8 = iVar8 + -1) {
            sVar1 = psVar15[uVar14];
            psVar15[uVar14] = psVar15[iVar5];
            psVar15[iVar5] = sVar1;
            psVar15 = psVar15 + 1;
          }
          uVar14 = uVar14 + iVar10;
          iVar5 = iVar5 - iVar10;
        }
      }
      free(local_58);
    }
    else {
      local_a0 = (stbi_uc *)0x0;
    }
  }
  return local_a0;
}

Assistant:

static stbi_uc *tga_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	read in the TGA header stuff
	int tga_offset = get8u(s);
	int tga_indexed = get8u(s);
	int tga_image_type = get8u(s);
	int tga_is_RLE = 0;
	int tga_palette_start = get16le(s);
	int tga_palette_len = get16le(s);
	int tga_palette_bits = get8u(s);
	int tga_x_origin = get16le(s);
	int tga_y_origin = get16le(s);
	int tga_width = get16le(s);
	int tga_height = get16le(s);
	int tga_bits_per_pixel = get8u(s);
	int tga_inverted = get8u(s);
	//	image data
	unsigned char *tga_data;
	unsigned char *tga_palette = NULL;
	int i, j;
	unsigned char raw_data[4];
	unsigned char trans_data[] = { 0,0,0,0 };
	int RLE_count = 0;
	int RLE_repeating = 0;
	int read_next_pixel = 1;
	//	do a tiny bit of precessing
	if( tga_image_type >= 8 )
	{
		tga_image_type -= 8;
		tga_is_RLE = 1;
	}
	/* int tga_alpha_bits = tga_inverted & 15; */
	tga_inverted = 1 - ((tga_inverted >> 5) & 1);

	//	error check
	if( //(tga_indexed) ||
		(tga_width < 1) || (tga_height < 1) ||
		(tga_image_type < 1) || (tga_image_type > 3) ||
		((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16) &&
		(tga_bits_per_pixel != 24) && (tga_bits_per_pixel != 32))
		)
	{
		return NULL;
	}

	//	If I'm paletted, then I'll use the number of bits from the palette
	if( tga_indexed )
	{
		tga_bits_per_pixel = tga_palette_bits;
	}

	//	tga info
	*x = tga_width;
	*y = tga_height;
	if( (req_comp < 1) || (req_comp > 4) )
	{
		//	just use whatever the file was
		req_comp = tga_bits_per_pixel / 8;
		*comp = req_comp;
	} else
	{
		//	force a new number of components
		*comp = tga_bits_per_pixel/8;
	}
	tga_data = (unsigned char*)malloc( tga_width * tga_height * req_comp );

	//	skip to the data's starting position (offset usually = 0)
	skip(s, tga_offset );
	//	do I need to load a palette?
	if( tga_indexed )
	{
		//	any data to skip? (offset usually = 0)
		skip(s, tga_palette_start );
		//	load the palette
		tga_palette = (unsigned char*)malloc( tga_palette_len * tga_palette_bits / 8 );
		getn(s, tga_palette, tga_palette_len * tga_palette_bits / 8 );
	}
	//	load the data
	for( i = 0; i < tga_width * tga_height; ++i )
	{
		//	if I'm in RLE mode, do I need to get a RLE chunk?
		if( tga_is_RLE )
		{
			if( RLE_count == 0 )
			{
				//	yep, get the next byte as a RLE command
				int RLE_cmd = get8u(s);
				RLE_count = 1 + (RLE_cmd & 127);
				RLE_repeating = RLE_cmd >> 7;
				read_next_pixel = 1;
			} else if( !RLE_repeating )
			{
				read_next_pixel = 1;
			}
		} else
		{
			read_next_pixel = 1;
		}
		//	OK, if I need to read a pixel, do it now
		if( read_next_pixel )
		{
			//	load however much data we did have
			if( tga_indexed )
			{
				//	read in 1 byte, then perform the lookup
				int pal_idx = get8u(s);
				if( pal_idx >= tga_palette_len )
				{
					//	invalid index
					pal_idx = 0;
				}
				pal_idx *= tga_bits_per_pixel / 8;
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = tga_palette[pal_idx+j];
				}
			} else
			{
				//	read in the data raw
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = get8u(s);
				}
			}
			//	convert raw to the intermediate format
			switch( tga_bits_per_pixel )
			{
			case 8:
				//	Luminous => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 16:
				//	Luminous,Alpha => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[1];
				break;
			case 24:
				//	BGR => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 32:
				//	BGRA => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[3];
				break;
			}
			//	clear the reading flag for the next pixel
			read_next_pixel = 0;
		} // end of reading a pixel
		//	convert to final format
		switch( req_comp )
		{
		case 1:
			//	RGBA => Luminance
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			break;
		case 2:
			//	RGBA => Luminance,Alpha
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			tga_data[i*req_comp+1] = trans_data[3];
			break;
		case 3:
			//	RGBA => RGB
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			break;
		case 4:
			//	RGBA => RGBA
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			tga_data[i*req_comp+3] = trans_data[3];
			break;
		}
		//	in case we're in RLE mode, keep counting down
		--RLE_count;
	}
	//	do I need to invert the image?
	if( tga_inverted )
	{
		for( j = 0; j*2 < tga_height; ++j )
		{
			int index1 = j * tga_width * req_comp;
			int index2 = (tga_height - 1 - j) * tga_width * req_comp;
			for( i = tga_width * req_comp; i > 0; --i )
			{
				unsigned char temp = tga_data[index1];
				tga_data[index1] = tga_data[index2];
				tga_data[index2] = temp;
				++index1;
				++index2;
			}
		}
	}
	//	clear my palette, if I had one
	if( tga_palette != NULL )
	{
		free( tga_palette );
	}
	//	the things I do to get rid of an error message, and yet keep
	//	Microsoft's C compilers happy... [8^(
	tga_palette_start = tga_palette_len = tga_palette_bits =
			tga_x_origin = tga_y_origin = 0;
	//	OK, done
	return tga_data;
}